

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputImpl.cpp
# Opt level: O0

Vector2i sf::priv::InputImpl::getMousePosition(Window *relativeTo)

{
  int local_4c;
  int local_48;
  int y;
  int x;
  uint buttons;
  int gy;
  int gx;
  Window child;
  Window root;
  Display *display;
  WindowHandle handle;
  Window *relativeTo_local;
  
  handle = (WindowHandle)relativeTo;
  display = (Display *)Window::getSystemHandle(relativeTo);
  if (display == (Display *)0x0) {
    Vector2<int>::Vector2((Vector2<int> *)&relativeTo_local);
  }
  else {
    root = (Window)OpenDisplay();
    local_48 = 0;
    local_4c = 0;
    XQueryPointer(root,display,&child,&gy,&buttons,&x,&local_48,&local_4c,&y);
    CloseDisplay((Display *)root);
    Vector2<int>::Vector2((Vector2<int> *)&relativeTo_local,local_48,local_4c);
  }
  return (Vector2i)relativeTo_local;
}

Assistant:

Vector2i InputImpl::getMousePosition(const Window& relativeTo)
{
    WindowHandle handle = relativeTo.getSystemHandle();
    if (handle)
    {
        // Open a connection with the X server
        Display* display = OpenDisplay();

        // we don't care about these but they are required
        ::Window root, child;
        int gx, gy;
        unsigned int buttons;

        int x = 0;
        int y = 0;
        XQueryPointer(display, handle, &root, &child, &gx, &gy, &x, &y, &buttons);

        // Close the connection with the X server
        CloseDisplay(display);

        return Vector2i(x, y);
    }
    else
    {
        return Vector2i();
    }
}